

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::GotoElement(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
              *this,RTPIPv6Destination *e)

{
  bool bVar1;
  int iVar2;
  RTPIPv6Destination *this_00;
  bool bVar3;
  bool found;
  int index;
  RTPIPv6Destination *e_local;
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  *this_local;
  
  iVar2 = RTPUDPv6Trans_GetHashIndex_IPv6Dest::GetIndex(e);
  if (iVar2 < 0x207d) {
    this->curhashelem = this->table[iVar2];
    bVar1 = false;
    while( true ) {
      bVar3 = false;
      if (!bVar1) {
        bVar3 = this->curhashelem != (HashElement *)0x0;
      }
      if (!bVar3) break;
      this_00 = HashElement::GetElement(this->curhashelem);
      bVar3 = RTPIPv6Destination::operator==(this_00,e);
      if (bVar3) {
        bVar1 = true;
      }
      else {
        this->curhashelem = this->curhashelem->hashnext;
      }
    }
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -5;
    }
  }
  else {
    this_local._4_4_ = -6;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::GotoElement(const Element &e)
{
	int index;
	bool found;
	
	index = GetIndex::GetIndex(e);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	curhashelem = table[index]; 
	found = false;
	while(!found && curhashelem != 0)
	{
		if (curhashelem->GetElement() == e)
			found = true;
		else
			curhashelem = curhashelem->hashnext;
	}
	if (!found)
		return ERR_RTP_HASHTABLE_ELEMENTNOTFOUND;
	return 0;
}